

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Uint32 Diligent::AdapterVendorToVendorId(ADAPTER_VENDOR Vendor)

{
  Uint32 UVar1;
  
  UVar1 = 0;
  if ((byte)(Vendor - ADAPTER_VENDOR_NVIDIA) < 10) {
    UVar1 = (&DAT_003622d4)[(byte)(Vendor - ADAPTER_VENDOR_NVIDIA)];
  }
  return UVar1;
}

Assistant:

Uint32 AdapterVendorToVendorId(ADAPTER_VENDOR Vendor)
{
    static_assert(ADAPTER_VENDOR_LAST == 10, "Please update the switch below to handle the new adapter type");
    switch (Vendor)
    {
#define VENDOR_TO_VENDOR_ID(Name) \
    case ADAPTER_VENDOR_##Name: return ADAPTER_VENDOR_ID_##Name

        VENDOR_TO_VENDOR_ID(AMD);
        VENDOR_TO_VENDOR_ID(NVIDIA);
        VENDOR_TO_VENDOR_ID(INTEL);
        VENDOR_TO_VENDOR_ID(ARM);
        VENDOR_TO_VENDOR_ID(QUALCOMM);
        VENDOR_TO_VENDOR_ID(IMGTECH);
        VENDOR_TO_VENDOR_ID(MSFT);
        VENDOR_TO_VENDOR_ID(APPLE);
        VENDOR_TO_VENDOR_ID(MESA);
        VENDOR_TO_VENDOR_ID(BROADCOM);
#undef VENDOR_TO_VENDOR_ID

        default:
            return 0;
    }
}